

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::FieldExpr::FieldExpr
          (FieldExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *object,
          Token *name,Token *oper)

{
  Token *oper_local;
  Token *name_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *object_local;
  FieldExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__FieldExpr_0016a6d8;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->object,object);
  Token::Token(&this->name,name);
  Token::Token(&this->oper,oper);
  return;
}

Assistant:

FieldExpr(std::unique_ptr<Expr> object, Token name, Token oper) :
                object{std::move(object)},
                name{std::move(name)},
                oper{std::move(oper)} {}